

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testClassification.cpp
# Opt level: O0

void anon_unknown.dwarf_63e5::testClass
               (half h,bool finite,bool normalized,bool denormalized,bool zero,bool nan,
               bool infinity,bool negative)

{
  bool bVar1;
  ostream *poVar2;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  ushort in_DI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  half local_2;
  
  local_2._h = in_DI;
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xf);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),8);
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,(half *)(ulong)local_2._h);
  std::operator<<(poVar2,"    ");
  printBits((ostream *)&std::cout,(half *)(ulong)local_2._h);
  std::operator<<((ostream *)&std::cout,"    ");
  bVar1 = half::isFinite(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"finite ");
  }
  bVar1 = half::isNormalized(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"normalized ");
  }
  bVar1 = half::isDenormalized(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"denormalized ");
  }
  bVar1 = half::isZero(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"zero ");
  }
  bVar1 = half::isNan(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"nan ");
  }
  bVar1 = half::isInfinity(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"infinity ");
  }
  bVar1 = half::isNegative(&local_2);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"negative ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = half::isFinite(&local_2);
  if (bVar1 != (bool)(in_SIL & 1)) {
    __assert_fail("h.isFinite() == finite",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x40,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = half::isNormalized(&local_2);
  if (bVar1 != (bool)(in_DL & 1)) {
    __assert_fail("h.isNormalized() == normalized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x41,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = half::isDenormalized(&local_2);
  if (bVar1 != (bool)(in_CL & 1)) {
    __assert_fail("h.isDenormalized() == denormalized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x42,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = half::isZero(&local_2);
  if (bVar1 != (bool)(in_R8B & 1)) {
    __assert_fail("h.isZero() == zero",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x43,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = half::isNan(&local_2);
  if (bVar1 != (bool)(in_R9B & 1)) {
    __assert_fail("h.isNan() == nan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x44,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = half::isInfinity(&local_2);
  if (bVar1 != (bool)(in_stack_00000008 & 1)) {
    __assert_fail("h.isInfinity() == infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x45,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  bVar1 = half::isNegative(&local_2);
  if (bVar1 != infinity) {
    __assert_fail("h.isNegative() == negative",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x46,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  return;
}

Assistant:

void
testClass (half h,
	   bool finite,
	   bool normalized,
	   bool denormalized,
	   bool zero,
	   bool nan,
	   bool infinity,
	   bool negative)
{
    cout.width (15);
    cout.precision (8);

    cout << h << "    ";
    printBits (cout, h);
    cout << "    ";

    if (h.isFinite())
	cout << "finite ";

    if (h.isNormalized())
	cout << "normalized ";

    if (h.isDenormalized())
	cout << "denormalized ";

    if (h.isZero())
	cout << "zero ";

    if (h.isNan())
	cout << "nan ";

    if (h.isInfinity())
	cout << "infinity ";

    if (h.isNegative())
	cout << "negative ";

    cout << endl;

    assert (h.isFinite() == finite);
    assert (h.isNormalized() == normalized);
    assert (h.isDenormalized() == denormalized);
    assert (h.isZero() == zero);
    assert (h.isNan() == nan);
    assert (h.isInfinity() == infinity);
    assert (h.isNegative() == negative);
}